

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  Token *pTVar5;
  TokenStream *remainingTokens_00;
  ParseState local_158;
  undefined1 local_128 [8];
  ParserResult result;
  BoundValueRefBase *valueRef;
  Token local_c0;
  Token *local_98;
  Token *token;
  TokenStream remainingTokens;
  undefined1 local_58 [8];
  Result validationResult;
  TokenStream *tokens_local;
  string *param_1_local;
  Arg *this_local;
  
  validationResult.m_errorMessage.field_2._8_8_ = tokens;
  (*(this->super_ParserRefImpl<Catch::clara::detail::Arg>).
    super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
            (local_58);
  bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_58);
  if (bVar1) {
    TokenStream::TokenStream
              ((TokenStream *)&token,(TokenStream *)validationResult.m_errorMessage.field_2._8_8_);
    TokenStream::operator*(&local_c0,(TokenStream *)&token);
    local_98 = &local_c0;
    if (local_c0.type == Argument) {
      peVar3 = std::
               __shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref);
      iVar2 = (*peVar3->_vptr_BoundRef[3])();
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Taywee[P]args/catch.hpp",
                      0x2485,
                      "virtual InternalParseResult Catch::clara::detail::Arg::parse(const std::string &, const TokenStream &) const"
                     );
      }
      peVar4 = std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->super_ParserRefImpl<Catch::clara::detail::Arg>).m_ref.
                           super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                         );
      result.m_errorMessage.field_2._8_8_ = peVar4;
      pTVar5 = TokenStream::operator->((TokenStream *)&token);
      (*peVar4->_vptr_BoundRef[4])(local_128,peVar4,&pTVar5->token);
      bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_128);
      if (bVar1) {
        remainingTokens_00 = TokenStream::operator++((TokenStream *)&token);
        ParseState::ParseState(&local_158,Matched,remainingTokens_00);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,&local_158);
        ParseState::~ParseState(&local_158);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (__return_storage_ptr__,
                   (BasicResult<Catch::clara::detail::ParseResultType> *)local_128);
      }
      remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseResultType> *)local_128);
    }
    else {
      ParseState::ParseState((ParseState *)&valueRef,NoMatch,(TokenStream *)&token);
      BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                (__return_storage_ptr__,(ParseState *)&valueRef);
      ParseState::~ParseState((ParseState *)&valueRef);
      remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    Token::~Token(&local_c0);
    TokenStream::~TokenStream((TokenStream *)&token);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,(BasicResult<void> *)local_58);
    remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  BasicResult<void>::~BasicResult((BasicResult<void> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }